

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol_p.h
# Opt level: O2

bool __thiscall QWidgetLineControl::composeMode(QWidgetLineControl *this)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QTextLayout::preeditAreaText();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_30.size != 0;
  }
  __stack_chk_fail();
}

Assistant:

bool composeMode() const { return !m_textLayout.preeditAreaText().isEmpty(); }